

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  global_State *g_00;
  global_State *g;
  int count_local;
  int mask_local;
  lua_Hook func_local;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  g._4_1_ = (byte)(mask & 0xfU);
  if ((func == (lua_Hook)0x0) || (_count_local = func, (mask & 0xfU) == 0)) {
    g._4_1_ = 0;
    _count_local = (lua_Hook)0x0;
  }
  g_00->hookf = _count_local;
  g_00->hookcstart = count;
  g_00->hookcount = count;
  g_00->hookmask = g_00->hookmask & 0xf0 | g._4_1_;
  g_00[1].tmptv.field_4.it = g_00[1].tmptv.field_4.it & 0xffffffef;
  lj_dispatch_update(g_00);
  return 1;
}

Assistant:

LUA_API int lua_sethook(lua_State *L, lua_Hook func, int mask, int count)
{
  global_State *g = G(L);
  mask &= HOOK_EVENTMASK;
  if (func == NULL || mask == 0) { mask = 0; func = NULL; }  /* Consistency. */
  g->hookf = func;
  g->hookcount = g->hookcstart = (int32_t)count;
  g->hookmask = (uint8_t)((g->hookmask & ~HOOK_EVENTMASK) | mask);
  lj_trace_abort(g);  /* Abort recording on any hook change. */
  lj_dispatch_update(g);
  return 1;
}